

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowFontScale(float scale)

{
  ImGuiContext *pIVar1;
  ImGuiWindow *this;
  float in_XMM0_Da;
  float fVar2;
  ImGuiWindow *window;
  ImGuiContext *g;
  
  pIVar1 = GImGui;
  if (0.0 < in_XMM0_Da) {
    this = GetCurrentWindow();
    this->FontWindowScale = in_XMM0_Da;
    fVar2 = ImGuiWindow::CalcFontSize(this);
    (pIVar1->DrawListSharedData).FontSize = fVar2;
    pIVar1->FontSize = fVar2;
    return;
  }
  __assert_fail("scale > 0.0f",
                "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                ,0x19df,"void ImGui::SetWindowFontScale(float)");
}

Assistant:

void ImGui::SetWindowFontScale(float scale)
{
    IM_ASSERT(scale > 0.0f);
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindow();
    window->FontWindowScale = scale;
    g.FontSize = g.DrawListSharedData.FontSize = window->CalcFontSize();
}